

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

pointer_type
cppcms::impl::
func_to_handler<booster::callback<void(cppcms::http::context::completion_type)>,cppcms::http::context::completion_type>
          (callback<void_(cppcms::http::context::completion_type)> *f,anon_enum_32 *p1)

{
  intrusive_ptr<booster::callable<void_()>_> *this;
  callable<void_()> *in_RDI;
  callable<void_()> *p;
  callback<void_(cppcms::http::context::completion_type)> *in_stack_ffffffffffffffd8;
  handler_fbinder_p1<booster::callback<void_(cppcms::http::context::completion_type)>,_cppcms::http::context::completion_type>
  *in_stack_ffffffffffffffe0;
  
  p = in_RDI;
  this = (intrusive_ptr<booster::callable<void_()>_> *)operator_new(0x20);
  handler_fbinder_p1<booster::callback<void_(cppcms::http::context::completion_type)>,_cppcms::http::context::completion_type>
  ::handler_fbinder_p1(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(anon_enum_32 *)this);
  booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            (this,p,SUB81((ulong)in_RDI >> 0x38,0));
  return (pointer_type)p;
}

Assistant:

booster::aio::handler::pointer_type func_to_handler(C const &f,P1 const &p1)
{
	return new handler_fbinder_p1<C,P1>(f,p1);
}